

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNDebugDstr::gen_code(CTPNDebugDstr *this,int param_2,int param_3)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  CTcDataStream::write2((CTcDataStream *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RDI >> 0x20));
  CTcDataStream::write
            (&G_cs->super_CTcDataStream,(int)*(undefined8 *)(in_RDI + 8),*(void **)(in_RDI + 0x10),
             0x402388);
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  CTcGenTarg::note_push((CTcGenTarg *)0x2813d5);
  CTcGenTarg::note_pop((CTcGenTarg *)0x2813e4);
  return;
}

Assistant:

void CTPNDebugDstr::gen_code(int, int)
{
    /* generate code to push the in-line string */
    G_cg->write_op(OPC_PUSHSTRI);
    G_cs->write2(len_);
    G_cs->write(str_, len_);

    /* write code to display the value */
    G_cg->write_op(OPC_SAYVAL);

    /* note that we pushed the string and then popped it */
    G_cg->note_push();
    G_cg->note_pop();
}